

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O3

bool __thiscall
jrtplib::RTPFakeTransmitter::SetMulticastTTL(RTPFakeTransmitter *this,uint8_t param_2)

{
  return true;
}

Assistant:

bool RTPFakeTransmitter::SetMulticastTTL(uint8_t)
{
/*	int ttl2,status;

	ttl2 = (int)ttl;
	status = setsockopt(rtpsock,IPPROTO_IP,IP_MULTICAST_TTL,(const char *)&ttl2,sizeof(int));
	if (status != 0)
		return false;
	status = setsockopt(rtcpsock,IPPROTO_IP,IP_MULTICAST_TTL,(const char *)&ttl2,sizeof(int));
	if (status != 0)
		return false;
	return true;*/
	return true;
}